

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::TSPI_PDU::SetMeasuredSpeedFlag(TSPI_PDU *this,KBOOL F)

{
  if ((((this->m_TSPIFlagUnion).m_ui8Flag & 0x20) == 0) == F) {
    (this->m_TSPIFlagUnion).m_ui8Flag = (this->m_TSPIFlagUnion).m_ui8Flag & 0xdf | F << 5;
    (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
         ((ushort)F * 4 + (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength) - 2;
  }
  return;
}

Assistant:

void TSPI_PDU::SetMeasuredSpeedFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_TSPIFlagUnion.m_ui8Spd )return;

    m_TSPIFlagUnion.m_ui8Spd = F;

    if( F )
    {
        m_ui16PDULength += 2; // 2 = size of KFIXED16.
    }
    else
    {
        m_ui16PDULength -= 2;
    }
}